

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O3

IntUnionFind *
Inferences::findDistributedVariants
          (IntUnionFind *__return_storage_ptr__,Stack<Kernel::Clause_*> *clauses,Substitution *subst
          ,InductionContext *context,Substitution *indLitSubst)

{
  Clause *this;
  _Hash_node_base *p_Var1;
  Clause *this_00;
  IntUnionFind *pIVar2;
  bool bVar3;
  void **head;
  Clause **ppCVar4;
  Literal *pLVar5;
  Literal *pLVar6;
  Literal **ppLVar7;
  size_type sVar8;
  Clause **ppCVar9;
  ulong uVar10;
  _Hash_node_base *p_Var11;
  Literal **ppLVar12;
  ulong uVar13;
  int c2;
  int iVar15;
  _Hash_node_base *p_Var16;
  Stack<Kernel::Literal_*> conclusionLits;
  ulong local_88;
  Stack<Kernel::Literal_*> local_80;
  IntUnionFind *local_60;
  InductionContext *local_58;
  Stack<Kernel::Clause_*> *local_50;
  ulong local_48;
  ulong local_40;
  Substitution *local_38;
  ulong uVar14;
  
  local_60 = __return_storage_ptr__;
  local_58 = context;
  local_38 = subst;
  Lib::IntUnionFind::IntUnionFind
            (__return_storage_ptr__,
             (int)((ulong)((long)clauses->_cursor - (long)clauses->_stack) >> 3));
  ppCVar4 = clauses->_stack;
  if (clauses->_cursor != ppCVar4) {
    uVar10 = 0;
    local_50 = clauses;
    do {
      this = ppCVar4[uVar10];
      local_80._capacity = (local_58->_cls)._M_h._M_element_count;
      if (local_80._capacity == 0) {
        local_80._stack = (Literal **)0x0;
        sVar8 = 0;
      }
      else {
        uVar13 = local_80._capacity * 8 + 0xf & 0xfffffffffffffff0;
        if (uVar13 == 0) {
          local_80._stack =
               (Literal **)
               Lib::FixedSizeAllocator<8UL>::alloc
                         ((FixedSizeAllocator<8UL> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
          sVar8 = local_80._capacity;
        }
        else if (uVar13 < 0x11) {
          local_80._stack =
               (Literal **)
               Lib::FixedSizeAllocator<16UL>::alloc
                         ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
          sVar8 = local_80._capacity;
        }
        else if (uVar13 < 0x19) {
          local_80._stack =
               (Literal **)
               Lib::FixedSizeAllocator<24UL>::alloc
                         ((FixedSizeAllocator<24UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
          sVar8 = local_80._capacity;
        }
        else if (uVar13 < 0x21) {
          local_80._stack =
               (Literal **)
               Lib::FixedSizeAllocator<32UL>::alloc
                         ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
          sVar8 = local_80._capacity;
        }
        else if (uVar13 < 0x31) {
          local_80._stack =
               (Literal **)
               Lib::FixedSizeAllocator<48UL>::alloc
                         ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
          sVar8 = local_80._capacity;
        }
        else if (uVar13 < 0x41) {
          local_80._stack =
               (Literal **)
               Lib::FixedSizeAllocator<64UL>::alloc
                         ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
          sVar8 = local_80._capacity;
        }
        else {
          local_80._stack = (Literal **)::operator_new(uVar13,0x10);
          sVar8 = local_80._capacity;
        }
      }
      local_80._end = local_80._stack + sVar8;
      ppLVar7 = local_80._stack;
      local_80._cursor = local_80._stack;
      if ((*(uint *)&this->field_0x38 & 0xfffff) != 0) {
        uVar13 = 0;
        local_48 = uVar10;
        do {
          pLVar5 = Kernel::Literal::complementaryLiteral(this->_literals[uVar13]);
          pLVar5 = Kernel::SubstHelper::apply<Kernel::Substitution>(pLVar5,local_38);
          for (p_Var16 = (local_58->_cls)._M_h._M_before_begin._M_nxt;
              p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
            p_Var1 = p_Var16[4]._M_nxt;
            for (p_Var11 = p_Var16[3]._M_nxt; p_Var11 != p_Var1; p_Var11 = p_Var11 + 1) {
              pLVar6 = (Literal *)p_Var11->_M_nxt;
              if (indLitSubst != (Substitution *)0x0) {
                pLVar6 = Kernel::SubstHelper::apply<Kernel::Substitution>(pLVar6,indLitSubst);
              }
              if (pLVar6 == pLVar5) {
                pLVar6 = this->_literals[uVar13];
                if (local_80._cursor == local_80._end) {
                  Lib::Stack<Kernel::Literal_*>::expand(&local_80);
                }
                *local_80._cursor = pLVar6;
                local_80._cursor = local_80._cursor + 1;
                break;
              }
            }
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < ((uint)*(undefined8 *)&this->field_0x38 & 0xfffff));
        ppLVar7 = local_80._stack;
        uVar10 = local_48;
        clauses = local_50;
        if (local_80._cursor != local_80._stack) {
          local_40 = (ulong)((int)local_48 + 1);
          ppCVar4 = local_50->_stack;
          ppCVar9 = local_50->_cursor;
          local_88 = 0;
          ppLVar12 = local_80._cursor;
          do {
            uVar13 = local_40;
            uVar14 = local_40 & 0xffffffff;
            if (local_40 < (ulong)((long)ppCVar9 - (long)ppCVar4 >> 3)) {
              do {
                c2 = (int)uVar14;
                if (((((int)uVar10 != c2) &&
                     (this_00 = ppCVar4[uVar13],
                     ((*(uint *)&this_00->field_0x38 ^ *(uint *)&this->field_0x38) & 0xfffff) == 0))
                    && (bVar3 = Kernel::Clause::contains(this_00,local_80._stack[local_88]), !bVar3)
                    ) && ((*(uint *)&this->field_0x38 & 0xfffff) != 0)) {
                  uVar13 = 0;
                  iVar15 = 0;
                  do {
                    bVar3 = Kernel::Clause::contains(this,this_00->_literals[uVar13]);
                    uVar10 = local_48;
                    clauses = local_50;
                    iVar15 = iVar15 + (uint)!bVar3;
                    uVar13 = uVar13 + 1;
                  } while (uVar13 < ((uint)*(undefined8 *)&this->field_0x38 & 0xfffff));
                  if (iVar15 == 1) {
                    Lib::IntUnionFind::doUnion(local_60,(int)local_48,c2);
                  }
                }
                uVar13 = (ulong)(c2 + 1);
                ppCVar4 = clauses->_stack;
                ppCVar9 = clauses->_cursor;
                ppLVar7 = local_80._stack;
                ppLVar12 = local_80._cursor;
                uVar14 = uVar13;
              } while (uVar13 < (ulong)((long)ppCVar9 - (long)ppCVar4 >> 3));
            }
            local_88 = (ulong)((int)local_88 + 1);
          } while (local_88 < (ulong)((long)ppLVar12 - (long)ppLVar7 >> 3));
        }
      }
      if (ppLVar7 != (Literal **)0x0) {
        uVar13 = local_80._capacity * 8 + 0xf & 0xfffffffffffffff0;
        if (uVar13 == 0) {
          *ppLVar7 = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppLVar7;
        }
        else if (uVar13 < 0x11) {
          *ppLVar7 = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppLVar7;
        }
        else if (uVar13 < 0x19) {
          *ppLVar7 = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppLVar7;
        }
        else if (uVar13 < 0x21) {
          *ppLVar7 = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppLVar7;
        }
        else if (uVar13 < 0x31) {
          *ppLVar7 = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppLVar7;
        }
        else if (uVar13 < 0x41) {
          *ppLVar7 = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppLVar7;
        }
        else {
          operator_delete(ppLVar7,0x10);
        }
      }
      uVar10 = (ulong)((int)uVar10 + 1);
      ppCVar4 = clauses->_stack;
    } while (uVar10 < (ulong)((long)clauses->_cursor - (long)ppCVar4 >> 3));
  }
  pIVar2 = local_60;
  Lib::IntUnionFind::evalComponents(local_60);
  return pIVar2;
}

Assistant:

IntUnionFind findDistributedVariants(const Stack<Clause*>& clauses, Substitution& subst, const InductionContext& context, Substitution* indLitSubst)
{
  const auto& toResolve = context._cls;
  IntUnionFind uf(clauses.size());
  for (unsigned i = 0; i < clauses.size(); i++) {
    auto cl = clauses[i];
    Stack<Literal*> conclusionLits(toResolve.size());
#if VDEBUG
    Stack<int> variantCounts(toResolve.size());
#endif
    // we first find the conclusion literals in cl, exactly 1 from
    // each of toResolve and save how many variants it should have
    for (unsigned k = 0; k < cl->length(); k++) {
      auto clit = SubstHelper::apply<Substitution>(Literal::complementaryLiteral((*cl)[k]), subst);
      for (const auto& kv : toResolve) {
#if VDEBUG
        bool found = false;
#endif
        for (const auto& lit : kv.second) {
          Literal* slit = indLitSubst ? SubstHelper::apply<Substitution>(lit, *indLitSubst) : lit;
          if (slit == clit) {
            conclusionLits.push((*cl)[k]);
#if VDEBUG
            variantCounts.push(kv.second.size()-1);
            ASS(!found);
            found = true;
#else
            break;
#endif
          }
        }
      }
    }
    // cl should have the same number of conclusion
    // literals as the size of toResolve
    ASS_EQ(conclusionLits.size(), toResolve.size());
    // now we look for the variants
    for (unsigned k = 0; k < conclusionLits.size(); k++) {
#if VDEBUG
      for (unsigned j = 0; j < clauses.size(); j++) {
#else
      for (unsigned j = i+1; j < clauses.size(); j++) {
#endif
        auto other = clauses[j];
        if (i == j || cl->length() != other->length()) {
          continue;
        }
        if (other->contains(conclusionLits[k])) {
          continue;
        }
        unsigned mismatchCnt = 0;
        for (unsigned l = 0; l < cl->length(); l++) {
          if (!cl->contains((*other)[l])) {
            mismatchCnt++;
          }
        }
        if (mismatchCnt == 1) {
#if VDEBUG
          variantCounts[k]--;
#endif
          uf.doUnion(i,j);
        }
      }
      ASS_LE(variantCounts[k],0);
    }
  }
  uf.evalComponents();
  return uf;
}

/**
 * Resolve a set of clauses given by findDistributedVariants with the
 * clauses from an induction context. The resulting clause can be seen
 * as the result of a sequence of resolutions and duplicate literal removals.
 * @param rsubst is for compatibility with default bound integer induction,
 *               it is stored separately so that we don't have to apply
 *               substitutions expensively in all cases.
 */
Clause* resolveClausesHelper(const InductionContext& context, const Stack<Clause*>& cls, IntUnionFind::ElementIterator eIt, Substitution& subst, bool generalized, bool applySubst, Substitution* indLitSubst)
{
  // first create the clause with the required size
  RobSubstitution renaming;
  ASS(eIt.hasNext());
  auto cl = cls[eIt.next()];
  auto premises = UnitList::singleton(cl);
  const auto& toResolve = context._cls;
  while (eIt.hasNext()) {
    auto other = cls[eIt.next()];
    UnitList::push(other,premises);
  }

  for (const auto& kv : toResolve) {
    UnitList::push(kv.first, premises);
  }

  Inference inf(GeneratingInferenceMany(
    generalized ? InferenceRule::GEN_INDUCTION_HYPERRESOLUTION
                : ( indLitSubst ? InferenceRule::FREE_VAR_INDUCTION_HYPERRESOLUTION : InferenceRule::INDUCTION_HYPERRESOLUTION),
    premises));
  RStack<Literal*> resLits;

  for (Literal* curr : cl->iterLits()) {
    auto clit = SubstHelper::apply<Substitution>(Literal::complementaryLiteral(curr), subst);
    bool contains = false;
    for (const auto& kv : toResolve) {
      for (const auto& lit : kv.second) {
        Literal* slit = indLitSubst ? SubstHelper::apply<Substitution>(lit, *indLitSubst) : lit;
        if (slit == clit) {
          contains = true;
          break;
        }
      }
      if (contains) {
        break;
      }
    }
    if (!contains) {
      Literal* resLit;
      if (applySubst) {
        TermReplacement tr(getContextReplacementMap(context, /*inverse=*/true));
        resLit = tr.transformLiteral(SubstHelper::apply<Substitution>(curr,subst));
      } else {
        resLit = curr;
      }
      resLits->push(renaming.apply(resLit,0));
    }
  }

  for (const auto& kv : toResolve) {
    for (unsigned i = 0; i < kv.first->length(); i++) {
      bool copyCurr = true;
      for (const auto& lit : kv.second) {
        TermReplacement tr(getContextReplacementMap(context, /*inverse=*/true));
        auto rlit = tr.transformLiteral(lit);
        if (rlit == (*kv.first)[i]) {
          copyCurr = false;
          break;
        }
      }
      if (copyCurr) {
        Literal* l = (*kv.first)[i];
        if (indLitSubst) {
          l = SubstHelper::apply<Substitution>((*kv.first)[i], *indLitSubst);
          TermReplacement tr(getContextReplacementMap(context, /*inverse=*/true));
          l = tr.transformLiteral(l);
        }
        resLits->push(renaming.apply(l,1));
      }
    }
  }

  return Clause::fromStack(*resLits, inf);
}

void InductionClauseIterator::resolveClauses(const ClauseStack& cls, const InductionContext& context, Substitution& subst, bool applySubst, Substitution* indLitSubst)
{
  ASS(cls.isNonEmpty());
  bool generalized = false;
  for (const auto& kv : context._cls) {
    for (const auto& lit : kv.second) {
      for (const auto& t : context._indTerms) {
        if (lit->containsSubterm(TermList(t))) {
          generalized = true;
          break;
        }
      }
      if (generalized) {
        break;
      }
    }
    if (generalized) {
      break;
    }
  }
  if (generalized) {
    env.statistics->generalizedInductionApplication++;
  } else if (indLitSubst) {
    env.statistics->nonGroundInductionApplication++;
  } else {
    env.statistics->inductionApplication++;
  }

  auto uf = findDistributedVariants(cls, subst, context, indLitSubst);
  IntUnionFind::ComponentIterator cit(uf);
  while(cit.hasNext()){
    IntUnionFind::ElementIterator eIt = cit.next();
    _clauses.push(resolveClausesHelper(context, cls, eIt, subst, generalized, applySubst, indLitSubst));
    if(_opt.showInduction()){
      std::cout << "[Induction] generate " << _clauses.top()->toString() << endl;
    }
  }
}

void InductionClauseIterator::performFinIntInduction(const InductionContext& context, const TermLiteralClause& lb, const TermLiteralClause& ub)
{
  InductionFormulaIndex::Entry* e = nullptr;
  if (notDoneInt(context, lb.literal, ub.literal, e)) {
    performIntInduction(context, e, true, lb, &ub);
    performIntInduction(context, e, false, ub, &lb);
  }
  resolveClauses(context, e, &lb, &ub);
}

void InductionClauseIterator::performInfIntInduction(const InductionContext& context, bool increasing, const TermLiteralClause& bound)
{
  InductionFormulaIndex::Entry* e = nullptr;
  if (notDoneInt(context, increasing ? bound.literal : nullptr, increasing ? nullptr : bound.literal, e)) {
    performIntInduction(context, e, increasing, bound, nullptr);
  }
  resolveClauses(context, e, increasing ? &bound : nullptr, increasing ? nullptr : &bound);
}


// Given a literal ~L[term], where 'term' is of the integer sort,
// introduce and induction hypothesis for integers, for example:
//   (L[b1] & (![X] : (b1 <= X & X < b2 & L[X]) -> L[x+1])) -> (![Y] : (b1 <= Y & Y <= b2) -> L[Y])
// In general, the hypothesis is an instance of one of the following
// hypotheses (depending on the value of 'increasing'):
//   (L[b1] & (![X] : (interval_x(X)) -> L[x+1])) -> (![Y] : interval_y(Y) -> L[Y])
//   (L[b1] & (![X] : (interval_x(X)) -> L[x-1])) -> (![Y] : interval_y(Y) -> L[Y])
// where 'b1' is bound1.term, and the predicates inteval_x(X) and interval_y(Y)
// capture the property "X (or Y) belongs to the interval [b1, b2] or [b1, b2)",
// where 'b2' is either optionalBound2->term (if present) or depending on 'increasing'
// either infinity or -infinity. (The intervals are set such that the hypothesis
// is valid: if interval_y(Y) holds for some Y, then either interval_x(Y) holds,
// or depending on 'increasing' either interval_x(Y-1) or interval_x(Y+1) holds.)
void InductionClauseIterator::performIntInduction(const InductionContext& context, InductionFormulaIndex::Entry* e, bool increasing, Coproduct<TermLiteralClause, DefaultBound> bound1, const TermLiteralClause* optionalBound2)
{
  TermList b1(bound1.apply([](auto x) { return x.term; }));
  TermList one(theory->representConstant(IntegerConstantType(increasing ? 1 : -1)));

  TermList x(0,false);
  TermList y(1,false);

  // create L[b1]
  Formula* Lb1 = context.getFormula({ b1 },true);

  // create L[X]
  Formula* Lx = context.getFormula({ x },true);

  // create L[Y]
  Substitution subst;
  Formula* Ly = context.getFormula({ y },true,&subst);

  // create L[X+1] or L[X-1]
  TermList fpo(Term::create2(env.signature->getInterpretingSymbol(Theory::INT_PLUS),x,one));
  Formula* Lxpo = context.getFormula({ fpo },true);

  static unsigned less = env.signature->getInterpretingSymbol(Theory::INT_LESS);
  // create X>=b1 (which is ~X<b1) or X<=b1 (which is ~b1<X)
  Formula* Lxcompb1 = new AtomicFormula(Literal::create2(less,false,(increasing ? x : b1),(increasing ? b1 : x)));
  // create Y>=b1 (which is ~Y<b1), or Y>b1, or Y<=b1 (which is ~b1<Y), or Y<b1
  // This comparison is mirroring the structure of bound1.literal, which is "b1 <comparison> inductionTerm".
  // If bound1.literal is nullptr, we are using the default bound with the comparison sign >= or <=.
  const bool isBound1Equal = bound1.match(
      [](TermLiteralClause const& bound1) { return (bound1.literal->functor() == less && bound1.literal->isNegative()); },
      [](DefaultBound) { return true; });
  const bool isBound1FirstArg = (increasing != isBound1Equal);
  Formula* Lycompb1 = new AtomicFormula(Literal::create2(
        less, !isBound1Equal, (isBound1FirstArg ? b1 : y), (isBound1FirstArg ? y : b1)));

  Formula* FxInterval;
  Formula* FyInterval;
  const bool isDefaultBound = bound1.template is<DefaultBound>();
  const bool hasBound2 = ((optionalBound2 != nullptr) && (optionalBound2->literal != nullptr));
  // Also resolve the hypothesis with comparisons with bound(s) (if the bound(s) are present/not default).
  if (hasBound2) {
    // Finite interval induction, use two bounds on both x and y.
    TermList b2(optionalBound2->term);
    if (b1 == b2) {
      return;
    }
    // create X<b2 or X>b2 (which is b2<X)
    Formula* Lxcompb2 = new AtomicFormula(Literal::create2(less, true, (increasing ? x : b2), (increasing ? b2 : x)));
    const bool isBound2Equal = (optionalBound2->literal->functor() == less && optionalBound2->literal->isNegative());
    const bool isBound2FirstArg = (increasing == isBound2Equal);
    // create Y<b2, or Y<=b2 (which is ~b2<Y) or Y>b2, or Y>=b2 (which is ~Y<b2)
    Formula* Lycompb2 = new AtomicFormula(Literal::create2(
          less, !isBound2Equal, (isBound2FirstArg ? b2 : y), (isBound2FirstArg ? y : b2)));
    FxInterval = new JunctionFormula(Connective::AND, FormulaList::cons(Lxcompb1, FormulaList::singleton(Lxcompb2)));
    FyInterval = new JunctionFormula(Connective::AND, FormulaList::cons(Lycompb1, FormulaList::singleton(Lycompb2)));
  } else {
    // Infinite interval induction (either with default bound or not), use only one bound on both x and y.
    FxInterval = Lxcompb1;
    FyInterval = Lycompb1;
  }

  // Create the hypothesis, with FxInterval and FyInterval being as described
  // in the comment above this function.
  Formula* hyp = new BinaryFormula(Connective::IMP,
                   new JunctionFormula(Connective::AND,FormulaList::cons(Lb1,FormulaList::singleton(
                     Formula::quantify(new BinaryFormula(Connective::IMP,
                       new JunctionFormula(Connective::AND, FormulaList::cons(FxInterval,FormulaList::singleton(Lx))),
                       Lxpo))))),
                   Formula::quantify(new BinaryFormula(Connective::IMP,FyInterval,Ly)));

  InferenceRule rule =
      isDefaultBound
          ? (increasing ? InferenceRule::INT_DB_UP_INDUCTION_AXIOM : InferenceRule::INT_DB_DOWN_INDUCTION_AXIOM)
          : (increasing ? (hasBound2 ? InferenceRule::INT_FIN_UP_INDUCTION_AXIOM : InferenceRule::INT_INF_UP_INDUCTION_AXIOM)
                        : (hasBound2 ? InferenceRule::INT_FIN_DOWN_INDUCTION_AXIOM : InferenceRule::INT_INF_DOWN_INDUCTION_AXIOM));

  auto cls = produceClauses(hyp, rule, context);
  e->add(std::move(cls), std::move(subst));
}

/**
 * Introduce the Induction Hypothesis
 * ( L[base1] & ... & L[basen] & (L[x] => L[c1(x)]) & ... (L[x] => L[cm(x)]) ) => L[x]
 * for some lit ~L[a]
 * and then force binary resolution on L for each resultant clause
 */

void InductionClauseIterator::performStructInductionOne(const InductionContext& context, InductionFormulaIndex::Entry* e)
{
  ASS_EQ(context._indTerms.size(), 1);
  TermList sort = SortHelper::getResultSort(context._indTerms[0]);
  TermAlgebra* ta = env.signature->getTermAlgebraOfSort(sort);
  unsigned numTypeArgs = sort.term()->arity();

  FormulaList* formulas = FormulaList::empty();

  unsigned var = 0;

  // first produce the formula
  for(unsigned i=0;i<ta->nConstructors();i++){
    TermAlgebraConstructor* con = ta->constructor(i);
    unsigned arity = con->arity();
      TermStack argTerms(arity);
      argTerms.loadFromIterator(Term::Iterator(sort.term()));
      TermStack ta_vars;
      for(unsigned j=numTypeArgs;j<arity;j++){
        TermList x(var,false);
        var++;
        if(con->argSort(j) == con->rangeSort()){
          ta_vars.push(x);
        }
        argTerms.push(x);
      }
      // if hypothesis strengthening is on, this replaces the Skolems with fresh variables
      auto right = context.getFormulaWithSquashedSkolems(
        { TermList(Term::create(con->functor(),(unsigned)argTerms.size(), argTerms.begin())) }, true, var);
      FormulaList* args = FormulaList::empty();
      TermStack::Iterator tvit(ta_vars);
      while(tvit.hasNext()){
        auto hypVars = VList::empty();
        auto hyp = context.getFormulaWithSquashedSkolems({ tvit.next() },true,var,&hypVars);
        // quantify each hypotheses with variables replacing Skolems explicitly
        if (hypVars) {
          hyp = new QuantifiedFormula(Connective::FORALL, hypVars, SList::empty(), hyp);
        }
        FormulaList::push(hyp,args);
      }
      FormulaList::push(args ?
        new BinaryFormula(Connective::IMP,JunctionFormula::generalJunction(Connective::AND,args),right) : right, formulas);
  }
  ASS(formulas);
  Formula* indPremise = JunctionFormula::generalJunction(Connective::AND,formulas);
  Substitution subst;
  auto conclusion = context.getFormulaWithSquashedSkolems({ TermList(var++,false) }, true, var, nullptr, &subst);
  Formula* hypothesis = new BinaryFormula(Connective::IMP,
                            Formula::quantify(indPremise),
                            Formula::quantify(conclusion));

  auto cls = produceClauses(hypothesis, InferenceRule::STRUCT_INDUCTION_AXIOM_ONE, context);
  e->add(std::move(cls), std::move(subst));
}

/**
 * This idea (taken from the CVC4 paper) is that there exists some smallest k that makes lit true
 * We produce the clause ~L[x] \/ ?y : L[y] & !z (z subterm y -> ~L[z])
 * and perform resolution with lit L[c]
 */
void InductionClauseIterator::performStructInductionTwo(const InductionContext& context, InductionFormulaIndex::Entry* e)
{
  ASS_EQ(context._indTerms.size(), 1);
  TermList sort = SortHelper::getResultSort(context._indTerms[0]);
  TermAlgebra* ta = env.signature->getTermAlgebraOfSort(sort);
  unsigned numTypeArgs = sort.term()->arity();

  // make L[y]
  TermList y(0,false); 
  unsigned var = 1;
  // if hypothesis strengthening is on, this replaces the Skolems with fresh variables
  auto mainVars = VList::singleton(y.var());
  auto Ly = context.getFormulaWithSquashedSkolems({ y },false,var,&mainVars);

  // for each constructor and destructor make
  // ![Z] : y = cons(Z,dec(y)) -> ( ~L[dec1(y)] & ~L[dec2(y)]
  FormulaList* formulas = FormulaList::empty();

  for(unsigned i=0;i<ta->nConstructors();i++){
    TermAlgebraConstructor* con = ta->constructor(i);
    unsigned arity = con->arity();

    if(con->recursive()){
  
      // First generate all argTerms and remember those that are of sort ta_sort 
      TermStack argTerms(arity);
      argTerms.loadFromIterator(Term::Iterator(sort.term()));
      TermStack taTerms;
      for(unsigned j=numTypeArgs;j<arity;j++){
        unsigned dj = con->destructorFunctor(j-numTypeArgs);
        TermStack dargTerms(numTypeArgs+1);
        dargTerms.loadFromIterator(Term::Iterator(sort.term()));
        dargTerms.push(y);
        TermList djy;
        if (con->argSort(j)==AtomicSort::boolSort()) {
          djy = TermList(Term::createFormula(new AtomicFormula(Literal::create(dj,dargTerms.size(),true,dargTerms.begin()))));
        } else {
          djy = TermList(Term::create(dj,dargTerms.size(),dargTerms.begin()));
        }
        argTerms.push(djy);
        if(con->argSort(j) == con->rangeSort()){
          taTerms.push(djy);
        }
      }
      ASS(taTerms.isNonEmpty());
      // create y = con1(...d1(y)...d2(y)...)
      TermList coni(Term::create(con->functor(),(unsigned)argTerms.size(), argTerms.begin()));
      Literal* kneq = Literal::createEquality(true,y,coni,con->rangeSort());
      FormulaList* And = FormulaList::empty(); 
      TermStack::Iterator tit(taTerms);
      while(tit.hasNext()){
        TermList djy = tit.next();
        auto hypVars = VList::empty();
        auto f = context.getFormulaWithSquashedSkolems({ djy },true,var,&hypVars);
        if (hypVars) {
          f = new QuantifiedFormula(Connective::FORALL, hypVars, SList::empty(), f);
        }
        FormulaList::push(f,And);
      }
      ASS(And);
      Formula* imp = new BinaryFormula(Connective::IMP,
                            new AtomicFormula(kneq),
                            JunctionFormula::generalJunction(Connective::AND,And));
      FormulaList::push(imp,formulas);
    }
  }
  // quantify with mainVars explicitly
  Formula* exists = new QuantifiedFormula(Connective::EXISTS, mainVars,SList::empty(),
                        formulas ? new JunctionFormula(Connective::AND,FormulaList::cons(Ly,formulas))
                                 : Ly);

  Substitution subst;
  auto conclusion = context.getFormulaWithSquashedSkolems({ TermList(var++, false) }, true, var, nullptr, &subst);
  FormulaList* orf = FormulaList::cons(exists,FormulaList::singleton(Formula::quantify(conclusion)));
  Formula* hypothesis = new JunctionFormula(Connective::OR,orf);

  auto cls = produceClauses(hypothesis, InferenceRule::STRUCT_INDUCTION_AXIOM_TWO, context);
  e->add(std::move(cls), std::move(subst));
}

/*
 * A variant of Two where we are stronger with respect to all subterms. here the existential part is
 *
 * ?y : L[y] &_{con_i} ( y = con_i(..dec(y)..) -> smaller(dec(y))) 
             & (!x : smallerThanY(x) -> smallerThanY(destructor(x))) 
             & !z : smallerThanY(z) => ~L[z]
 *
 * i.e. we add a new special predicat that is true when its argument is smaller than Y
 *
 */
void InductionClauseIterator::performStructInductionThree(const InductionContext& context, InductionFormulaIndex::Entry* e)
{
  ASS_EQ(context._indTerms.size(), 1);
  TermList sort = SortHelper::getResultSort(context._indTerms[0]);
  TermAlgebra* ta = env.signature->getTermAlgebraOfSort(sort);
  unsigned numTypeArgs = sort.term()->arity();

  // make L[y]
  TermList x(0,false); 
  TermList y(1,false); 
  TermList z(2,false); 
  unsigned vars = 3;
  // if hypothesis strengthening is on, this replaces the Skolems with fresh variables
  auto mainVars = VList::singleton(y.var());
  auto Ly = context.getFormulaWithSquashedSkolems({ y },false,vars,&mainVars);

  // make smallerThanY
  unsigned sty = env.signature->addFreshPredicate(1,"smallerThan");
  env.signature->getPredicate(sty)->setType(OperatorType::getPredicateType({sort}));

  // make ( y = con_i(..dec(y)..) -> smaller(dec(y)))  for each constructor 
  FormulaList* conjunction = FormulaList::singleton(Ly);
  for(unsigned i=0;i<ta->nConstructors();i++){
    TermAlgebraConstructor* con = ta->constructor(i);
    unsigned arity = con->arity();

    if(con->recursive()){
      // First generate all argTerms and remember those that are of sort ta_sort 
      TermStack argTerms(arity);
      argTerms.loadFromIterator(Term::Iterator(sort.term()));
      TermStack taTerms;
      Stack<unsigned> ta_vars;
      TermStack varTerms(arity);
      varTerms.loadFromIterator(Term::Iterator(sort.term()));
      for(unsigned j=numTypeArgs;j<arity;j++){
        unsigned dj = con->destructorFunctor(j-numTypeArgs);
        TermStack dargTerms(numTypeArgs+1);
        dargTerms.loadFromIterator(Term::Iterator(sort.term()));
        dargTerms.push(y);
        TermList djy;
        if (con->argSort(j)==AtomicSort::boolSort()) {
          djy = TermList(Term::createFormula(new AtomicFormula(Literal::create(dj,dargTerms.size(),true,dargTerms.begin()))));
        } else {
          djy = TermList(Term::create(dj,dargTerms.size(),dargTerms.begin()));
        }
        argTerms.push(djy);
        TermList xj(vars,false);
        varTerms.push(xj);
        if(con->argSort(j) == con->rangeSort()){
          taTerms.push(djy);
          ta_vars.push(vars);
        }
        vars++;
      }
      // create y = con1(...d1(y)...d2(y)...)
      TermList coni(Term::create(con->functor(),(unsigned)argTerms.size(), argTerms.begin()));
      Literal* kneq = Literal::createEquality(true,y,coni,sort);

      // create smaller(cons(x1,..,xn))
      Formula* smaller_coni = new AtomicFormula(Literal::create1(sty,true,
                                TermList(Term::create(con->functor(),(unsigned)varTerms.size(),varTerms.begin()))));

      FormulaList* smallers = FormulaList::empty();
      Stack<unsigned>::Iterator vtit(ta_vars);
      while(vtit.hasNext()){
        FormulaList::push(new AtomicFormula(Literal::create1(sty,true,TermList(vtit.next(),false))),smallers);
      }
      ASS(smallers);
      Formula* ax = Formula::quantify(new BinaryFormula(Connective::IMP,smaller_coni,
                      JunctionFormula::generalJunction(Connective::AND,smallers)));

      // now create a conjunction of smaller(d(y)) for each d
      FormulaList* And = FormulaList::empty(); 
      TermStack::Iterator tit(taTerms);
      while(tit.hasNext()){
        Formula* f = new AtomicFormula(Literal::create1(sty,true,tit.next()));
        FormulaList::push(f,And);
      }
      ASS(And);
      Formula* imp = new BinaryFormula(Connective::IMP,
                            new AtomicFormula(kneq),
                            JunctionFormula::generalJunction(Connective::AND,And));

      FormulaList::push(imp,conjunction);
      FormulaList::push(ax,conjunction);
    } 
  }
  // now !z : smallerThanY(z) => ~L[z]
  Formula* smallerImpNL = Formula::quantify(new BinaryFormula(Connective::IMP, 
                            new AtomicFormula(Literal::create1(sty,true,z)),
                            context.getFormulaWithSquashedSkolems({ z },true,vars)));

  FormulaList::push(smallerImpNL,conjunction);
  // quantify with mainVars explicitly
  Formula* exists = new QuantifiedFormula(Connective::EXISTS, mainVars,SList::empty(),
                       new JunctionFormula(Connective::AND,conjunction));

  Substitution subst;
  auto conclusion = context.getFormulaWithSquashedSkolems({ x },true,vars,nullptr,&subst);
  FormulaList* orf = FormulaList::cons(exists,FormulaList::singleton(Formula::quantify(conclusion)));
  Formula* hypothesis = new JunctionFormula(Connective::OR,orf);

  auto cls = produceClauses(hypothesis, InferenceRule::STRUCT_INDUCTION_AXIOM_THREE, context);
  e->add(std::move(cls), std::move(subst));
}

void InductionClauseIterator::performRecursionInduction(const InductionContext& context, const InductionTemplate* templ, const std::vector<Term*>& typeArgs, InductionFormulaIndex::Entry* e)
{
  unsigned var = 0;
  FormulaList* formulas = FormulaList::empty();
  std::vector<TermList> ts(context._indTerms.size(), TermList());
  auto& indPos = templ->inductionPositions();
  auto header = templ->branches().begin()->_header;
  Substitution typeSubst;
  ASS_EQ(typeArgs.size(),header->numTypeArguments());
  for (unsigned i = 0; i < header->numTypeArguments(); i++) {
    auto arg = *header->nthArgument(i);
    ASS(arg.isVar());
    typeSubst.bind(arg.var(),typeArgs[i]);
  }

  for (const auto& b : templ->branches()) {
    Renaming rn(var);
    rn.normalizeVariables(b._header);
    auto header = rn.apply(b._header->apply(typeSubst));
    unsigned j = 0;
    for (unsigned i = 0; i < header->arity(); i++) {
      if (indPos[i]) {
        ts[j++] = *header->nthArgument(i);
      }
    }
    auto right = context.getFormula(ts, true);
    FormulaList* hyps = FormulaList::empty();
    for (const auto& r : b._recursiveCalls) {
      j = 0;
      auto rr = rn.apply(r->apply(typeSubst));
      for (unsigned i = 0; i < rr->arity(); i++) {
        if (indPos[i]) {
          ts[j++] = *rr->nthArgument(i);
        }
      }
      FormulaList::push(context.getFormula(ts,true),hyps);
    }
    FormulaList::push(hyps ?
      new BinaryFormula(Connective::IMP,JunctionFormula::generalJunction(Connective::AND,hyps),right) : right, formulas);
    var = rn.nextVar();
  }
  ASS(formulas);
  Formula* indPremise = JunctionFormula::generalJunction(Connective::AND,formulas);
  Substitution subst;
  for (auto& t : ts) {
    t = TermList(var++,false);
  }
  auto conclusion = context.getFormula(ts, true, &subst);
  Formula* hypothesis = new BinaryFormula(Connective::IMP, Formula::quantify(indPremise), Formula::quantify(conclusion));

  auto cls = produceClauses(hypothesis, InferenceRule::STRUCT_INDUCTION_AXIOM_RECURSION, context);
  e->add(std::move(cls), std::move(subst));
}

/*
Creates the structural induction axiom with an existentially quantified variable:
?y,w. !u0,us,z. ?x. (L[0, u0] & (L[y, w] -> L[s(y), us]) -> L[z, x])
*/
void InductionClauseIterator::performStructInductionFreeVar(const InductionContext& context, InductionFormulaIndex::Entry* e, Substitution* freeVarSubst)
{
  if (context._indTerms.size() > 1) return;
  TermAlgebra* ta = env.signature->getTermAlgebraOfSort(SortHelper::getResultSort(context._indTerms[0]));
  unsigned freeVar = context.getFreeVariable(); // variable free in the induction literal
  unsigned var = freeVar+1; // used in the following to construct new variables
  for (const auto& kv : context._cls) {
    if (kv.first->maxVar() + 1 > var) {
      var = kv.first->maxVar() + 1;
    }
  }
  VList* us = VList::empty();
  VList* ws = VList::empty();
  VList* ys = VList::empty();
  FormulaList* formulas = FormulaList::empty();

  // Construct premise as a conjunction of steps.
  // Each step's antecedent contains a fresh free variable in place
  // of freeVar (collected in `ws`), each step's conclusion too (collected in `us`).
  for (unsigned i = 0; i < ta->nConstructors(); i++){
    TermAlgebraConstructor* con = ta->constructor(i);
    unsigned arity = con->arity();
    TermStack argTerms(arity); // Arguments of the step case antecedent: y_1, ..., y_arity
    FormulaList* hyps = FormulaList::empty();
    for (unsigned j = 0; j < arity; j++){
      TermList y(var++, false);
      argTerms.push(y);
      VList::push(y.var(), ys);
      if (con->argSort(j) == con->rangeSort()){
        TermList w(var++, false);
        VList::push(w.var(), ws);
        Formula* curLit = context.getFormulaWithFreeVar({ y }, true, freeVar, w);
        FormulaList::push(curLit, hyps); // L[y_j, w_j]
      }
    }
    TermList u(var++, false);
    VList::push(u.var(), us);
    Term* tcons = Term::create(con->functor(), (unsigned)argTerms.size(), argTerms.begin());
    Formula* consequent = context.getFormulaWithFreeVar({ TermList(tcons) }, true, freeVar, u);
    Formula* step = (VList::isEmpty(ws)) ? consequent :
      new BinaryFormula(Connective::IMP, JunctionFormula::generalJunction(Connective::AND, hyps), consequent); // (/\_{j ∈ P_c} L[y_j, w_j]) --> L[cons(y_1, ..., y_n), u_i]
    formulas->push(step, formulas);
  }
  Formula* formula = new JunctionFormula(Connective::AND, formulas);

  // Construct conclusion: L[z, x]
  TermList z(var++, false);
  const unsigned xvar = var;
  TermList x(var++, false);
  Substitution subst;
  Formula* conclusion = context.getFormulaWithFreeVar({ z }, true, freeVar, x, &subst);
  // Put together the whole induction axiom:
  formula = new BinaryFormula(Connective::IMP, formula, conclusion);
  formula = new QuantifiedFormula(Connective::EXISTS, VList::singleton(xvar), SList::empty(), formula);
  formula = new QuantifiedFormula(Connective::FORALL, VList::singleton(z.var()), SList::empty(), formula);
  formula = new QuantifiedFormula(Connective::FORALL, us, SList::empty(), formula);
  if (!VList::isEmpty(ws)) {
    formula = new QuantifiedFormula(Connective::EXISTS, ws, SList::empty(), formula);
  }
  if (!VList::isEmpty(ys)) {
    formula = new QuantifiedFormula(Connective::EXISTS, ys, SList::empty(), formula);
  }

  // Produce induction clauses and obtain the skolemization bindings.
  DHMap<unsigned, Term*> bindings;
  ClauseStack hyp_clauses = produceClauses(formula, InferenceRule::STRUCT_INDUCTION_AXIOM_ONE, context, &bindings); 
  // Bind freeVar to its corresponding skolem term in freeVarSubst.
  // This is used later in resolution.
  Term* xSkolem = bindings.get(xvar, nullptr);
  ASS(xSkolem != nullptr);
  ASS(freeVarSubst != nullptr);
  freeVarSubst->bind(int(freeVar), SubstHelper::apply<Substitution>(xSkolem, subst));

  e->add(std::move(hyp_clauses), std::move(subst));
  return;
}

bool InductionClauseIterator::notDoneInt(InductionContext context, Literal* bound1, Literal* bound2, InductionFormulaIndex::Entry*& e)
{
  ASS_EQ(context._indTerms.size(), 1);
  TermList ph(getPlaceholderForTerm(context._indTerms,0));
  Literal* b1 = nullptr;
  Literal* b2 = nullptr;
  if (bound1) {
    b1 = Literal::create2(bound1->functor(), bound1->polarity(),
      bound1->polarity() ? *bound1->nthArgument(0) : ph,
      bound1->polarity() ? ph : *bound1->nthArgument(1));
  }
  if (bound2) {
    b2 = Literal::create2(bound2->functor(), bound2->polarity(),
      bound2->polarity() ? ph : *bound2->nthArgument(0),
      bound2->polarity() ? *bound2->nthArgument(1) : ph);
  }
  return _formulaIndex.findOrInsert(context, e, b1, b2);
}

bool InductionClauseIterator::isValidBound(const InductionContext& context, const Bound& bound)
{
  ASS_EQ(context._indTerms.size(), 1);
  Term* pt = getPlaceholderForTerm(context._indTerms,0);
  for (const auto& kv : context._cls) {
    for (const auto& lit : kv.second) {
      ASS((lit != nullptr) && (kv.first != nullptr));
      Term* otherArg = InductionHelper::getOtherTermFromComparison(lit, pt);
      if (!bound.match(
            [&](TermLiteralClause const&  bound) 
            { return InductionHelper::isValidBound(otherArg, kv.first, bound); },
            [&](DefaultBound const& bound) 
            { return InductionHelper::isValidForDefaultBound(otherArg, kv.first, bound.term); }
            )) {
        return false;
      }
    }
  }
  return true;
}

}